

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hpp
# Opt level: O3

ostream * detail::operator<<(ostream *os,print_hex<unsigned_long> *s)

{
  uint uVar1;
  
  uVar1 = *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]);
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
  *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
       *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
       uVar1 & 0x4a | *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) & 0xffffffb5;
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const print_hex<T> & s) {
	
	std::ios_base::fmtflags old = os.flags();
	
	os << "0x" << std::hex << s.value;
	
	os.setf(old, std::ios_base::basefield);
	return os;
}